

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaElementDecl.cpp
# Opt level: O0

XMLAttDefList * __thiscall xercesc_4_0::SchemaElementDecl::getAttDefList(SchemaElementDecl *this)

{
  RuntimeException *this_00;
  MemoryManager *memoryManager;
  XMLAttDefList *pXVar1;
  SchemaElementDecl *this_local;
  
  if (this->fComplexTypeInfo == (ComplexTypeInfo *)0x0) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    memoryManager = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaElementDecl.cpp"
               ,0x78,DV_InvalidOperation,memoryManager);
    __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  pXVar1 = ComplexTypeInfo::getAttDefList(this->fComplexTypeInfo);
  return pXVar1;
}

Assistant:

XMLAttDefList& SchemaElementDecl::getAttDefList() const
{
    if (!fComplexTypeInfo)
	{
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::DV_InvalidOperation, getMemoryManager());
    }

	return fComplexTypeInfo->getAttDefList();
}